

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O1

optional<QHttpHeaders::WellKnownHeader> __thiscall
HeaderName::toWellKnownHeader(HeaderName *this,QByteArrayView name)

{
  byte bVar1;
  HeaderName *pHVar2;
  int iVar3;
  ulong uVar4;
  HeaderName *pHVar5;
  quint8 *pqVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  View VVar10;
  
  pqVar6 = "";
  uVar4 = 0xb1;
  do {
    uVar7 = uVar4 >> 1;
    VVar10 = QOffsetStringArray<std::array<char,_2515UL>,_std::array<unsigned_short,_178UL>_>::
             viewAt(&headerNames,(ulong)pqVar6[uVar7]);
    pHVar5 = (HeaderName *)VVar10.m_size;
    lVar8 = (long)pHVar5 - (long)this;
    if (this <= pHVar5) {
      pHVar5 = this;
    }
    if (pHVar5 == (HeaderName *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = memcmp(VVar10.m_data,(void *)name.m_size,(size_t)pHVar5);
    }
    if (iVar3 == 0) {
      if (lVar8 < -0x7fffffff) {
        lVar8 = -0x80000000;
      }
      if (0x7ffffffe < lVar8) {
        lVar8 = 0x7fffffff;
      }
      iVar3 = (int)lVar8;
    }
    if (iVar3 < 0) {
      pqVar6 = pqVar6 + uVar7 + 1;
      uVar7 = ~uVar7 + uVar4;
    }
    uVar4 = uVar7;
  } while (0 < (long)uVar7);
  if (pqVar6 != (quint8 *)"\n\n") {
    bVar1 = *pqVar6;
    uVar7 = (ulong)bVar1;
    uVar4 = 0xb1;
    if (bVar1 < 0xb1) {
      uVar4 = (ulong)(uint)bVar1;
    }
    uVar4 = (ulong)headerNames.m_offsets._M_elems[uVar4];
    pHVar5 = (HeaderName *)0xffffffffffffffff;
    do {
      pHVar2 = pHVar5 + 0x12fef;
      pHVar5 = (HeaderName *)
               ((long)&(pHVar5->data).super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>
                       .super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                       super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 1);
    } while (*(char *)((long)&(pHVar2->data).
                              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>
                      + uVar4 + 0x11) != '\0');
    if (this == pHVar5) {
      uVar9 = 0x100000000;
      if (this == (HeaderName *)0x0) goto LAB_00190f68;
      iVar3 = bcmp((void *)name.m_size,headerNames.m_string._M_elems + uVar4,(size_t)this);
      if (iVar3 == 0) goto LAB_00190f68;
    }
  }
  uVar9 = 0;
LAB_00190f68:
  return (optional<QHttpHeaders::WellKnownHeader>)(uVar7 & 0xffffffff | uVar9);
}

Assistant:

static std::optional<QHttpHeaders::WellKnownHeader> toWellKnownHeader(QByteArrayView name) noexcept
    {
        auto indexesBegin = std::cbegin(orderedHeaderNameIndexes);
        auto indexesEnd = std::cend(orderedHeaderNameIndexes);

        auto result = std::lower_bound(indexesBegin, indexesEnd, name, ByIndirectHeaderName{});

        if (result != indexesEnd && name == headerNames[*result])
            return static_cast<QHttpHeaders::WellKnownHeader>(*result);
        return std::nullopt;
    }